

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-calcs.c
# Opt level: O0

void update_stuff(player *p)

{
  _Bool _Var1;
  player *p_local;
  
  if (p->upkeep->update != 0) {
    if ((p->upkeep->update & 0x400) != 0) {
      p->upkeep->update = p->upkeep->update & 0xfffffbff;
      calc_inventory(p);
    }
    if ((p->upkeep->update & 1) != 0) {
      p->upkeep->update = p->upkeep->update & 0xfffffffe;
      update_bonuses(p);
    }
    if ((p->upkeep->update & 2) != 0) {
      p->upkeep->update = p->upkeep->update & 0xfffffffd;
      calc_light(p,&p->state,true);
    }
    if ((p->upkeep->update & 4) != 0) {
      p->upkeep->update = p->upkeep->update & 0xfffffffb;
      calc_hitpoints(p);
    }
    if ((p->upkeep->update & 8) != 0) {
      p->upkeep->update = p->upkeep->update & 0xfffffff7;
      calc_mana(p,&p->state,true);
    }
    if (((p->upkeep->update & 0x10) != 0) &&
       (p->upkeep->update = p->upkeep->update & 0xffffffef, 0 < (p->class->magic).total_spells)) {
      calc_spells(p);
    }
    if ((p->upkeep->update & 0x20) != 0) {
      p->upkeep->update = p->upkeep->update & 0xffffffdf;
      calc_specialty(p);
    }
    if (((character_generated & 1U) != 0) && (_Var1 = map_is_visible(), _Var1)) {
      if ((p->upkeep->update & 0x40) != 0) {
        p->upkeep->update = p->upkeep->update & 0xffffffbf;
        update_view(cave,p);
      }
      if ((p->upkeep->update & 0x100) != 0) {
        p->upkeep->update = p->upkeep->update & 0xfffffeff;
        p->upkeep->update = p->upkeep->update & 0xffffff7f;
        update_monsters(true);
      }
      if ((p->upkeep->update & 0x80) != 0) {
        p->upkeep->update = p->upkeep->update & 0xffffff7f;
        update_monsters(false);
      }
      if ((p->upkeep->update & 0x200) != 0) {
        p->upkeep->update = p->upkeep->update & 0xfffffdff;
        event_signal(EVENT_PLAYERMOVED);
      }
    }
  }
  return;
}

Assistant:

void update_stuff(struct player *p)
{
	/* Update stuff */
	if (!p->upkeep->update) return;


	if (p->upkeep->update & (PU_INVEN)) {
		p->upkeep->update &= ~(PU_INVEN);
		calc_inventory(p);
	}

	if (p->upkeep->update & (PU_BONUS)) {
		p->upkeep->update &= ~(PU_BONUS);
		update_bonuses(p);
	}

	if (p->upkeep->update & (PU_TORCH)) {
		p->upkeep->update &= ~(PU_TORCH);
		calc_light(p, &p->state, true);
	}

	if (p->upkeep->update & (PU_HP)) {
		p->upkeep->update &= ~(PU_HP);
		calc_hitpoints(p);
	}

	if (p->upkeep->update & (PU_MANA)) {
		p->upkeep->update &= ~(PU_MANA);
		calc_mana(p, &p->state, true);
	}

	if (p->upkeep->update & (PU_SPELLS)) {
		p->upkeep->update &= ~(PU_SPELLS);
		if (p->class->magic.total_spells > 0) {
			calc_spells(p);
		}
	}

	if (p->upkeep->update & (PU_SPECIALTY)) {
		p->upkeep->update &= ~(PU_SPECIALTY);
		calc_specialty(p);
	}

	/* Character is not ready yet, no map updates */
	if (!character_generated) return;

	/* Map is not shown, no map updates */
	if (!map_is_visible()) return;

	if (p->upkeep->update & (PU_UPDATE_VIEW)) {
		p->upkeep->update &= ~(PU_UPDATE_VIEW);
		update_view(cave, p);
	}

	if (p->upkeep->update & (PU_DISTANCE)) {
		p->upkeep->update &= ~(PU_DISTANCE);
		p->upkeep->update &= ~(PU_MONSTERS);
		update_monsters(true);
	}

	if (p->upkeep->update & (PU_MONSTERS)) {
		p->upkeep->update &= ~(PU_MONSTERS);
		update_monsters(false);
	}


	if (p->upkeep->update & (PU_PANEL)) {
		p->upkeep->update &= ~(PU_PANEL);
		event_signal(EVENT_PLAYERMOVED);
	}
}